

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::reason
          (DefaultUnfoundedCheck *this,Solver *param_2,Literal p,LitVec *r)

{
  bool bVar1;
  Var VVar2;
  Literal *in_RCX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDI;
  const_iterator end;
  const_iterator it;
  Literal *in_stack_ffffffffffffffa8;
  Literal *in_stack_ffffffffffffffb0;
  long lVar3;
  Literal *in_stack_ffffffffffffffb8;
  iterator local_30;
  iterator local_28;
  Literal local_4;
  
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     &in_RDI[0xd].ebo_.size);
  if (!bVar1) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)&in_RDI[0xd].ebo_.size
               ,0);
    bVar1 = Clasp::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      local_28 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            &in_RDI[0xd].ebo_.size);
      local_28 = local_28 + 1;
      local_30 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            &in_RDI[0xd].ebo_.size);
      goto LAB_0020edaa;
    }
  }
  lVar3._0_4_ = in_RDI[0xe].ebo_.size;
  lVar3._4_4_ = in_RDI[0xe].ebo_.cap;
  VVar2 = Literal::var(&local_4);
  local_28 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (lVar3 + (ulong)(VVar2 - 1) * 0x10));
  in_stack_ffffffffffffffb8 = *(Literal **)&in_RDI[0xe].ebo_.size;
  VVar2 = Literal::var(&local_4);
  local_30 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_stack_ffffffffffffffb8 + (ulong)(VVar2 - 1) * 4));
LAB_0020edaa:
  for (; local_28 != local_30; local_28 = local_28 + 1) {
    Literal::operator~(in_RCX);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (in_RDI,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::reason(Solver&, Literal p, LitVec& r) {
	LitVec::const_iterator it, end;
	if (!activeClause_.empty() && activeClause_[0] == p) {
		it  = activeClause_.begin()+1;
		end = activeClause_.end();
	}
	else {
		assert(strategy_ == only_reason && reasons_);
		it  = reasons_[p.var()-1].begin();
		end = reasons_[p.var()-1].end();
	}
	for (; it != end; ++it) r.push_back( ~*it );
}